

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMarkers::IntLoadResidual_F(ChLinkMarkers *this,uint off,ChVectorDynamic<> *R,double c)

{
  long *plVar1;
  ulong *puVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChBodyFrame *pCVar37;
  ChMarker *pCVar38;
  byte bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar56;
  double *pdVar57;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Index index;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  undefined4 in_register_00000034;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  long in_XMM0_Qb;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  double dVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  Vector m_abs_force;
  Vector mbody_torque;
  Vector mbody_force;
  ChVector<double> local_d8;
  long lStack_c0;
  double dStack_b8;
  long lStack_b0;
  ChVector<double> CStack_a8;
  undefined1 local_88 [16];
  long alStack_78 [2];
  ChVector<double> CStack_68;
  long lStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  if ((this->super_ChLink).Body1 == (ChBodyFrame *)0x0) {
    return;
  }
  pCVar37 = (this->super_ChLink).Body2;
  if (pCVar37 == (ChBodyFrame *)0x0) {
    return;
  }
  CStack_68.m_data[2] = 0.0;
  CStack_a8.m_data[2] = 0.0;
  CStack_68.m_data[0] = 0.0;
  CStack_68.m_data[1] = 0.0;
  CStack_a8.m_data[0] = 0.0;
  CStack_a8.m_data[1] = 0.0;
  dVar104 = (this->C_force).m_data[0];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar104;
  dVar3 = (this->C_force).m_data[1];
  dVar4 = (this->C_force).m_data[2];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar4;
  dStack_b8 = c;
  lStack_b0 = in_XMM0_Qb;
  if (((((dVar104 != 0.0) || (NAN(dVar104))) || (dVar3 != 0.0)) || ((NAN(dVar3) || (dVar4 != 0.0))))
     || (NAN(dVar4))) {
    pCVar38 = this->marker2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar105._8_8_ = 0;
    auVar105._0_8_ =
         dVar3 * (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar5 = vfmadd231sd_fma(auVar105,auVar73,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar100._8_8_ = 0;
    auVar100._0_8_ =
         dVar3 * (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    auVar6 = vfmadd231sd_fma(auVar100,auVar73,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar94._8_8_ = 0;
    auVar94._0_8_ =
         dVar3 * (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
    auVar73 = vfmadd231sd_fma(auVar94,auVar73,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar5 = vfmadd231sd_fma(auVar5,auVar85,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar6 = vfmadd231sd_fma(auVar6,auVar85,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar73 = vfmadd231sd_fma(auVar73,auVar85,auVar10);
    dVar104 = auVar5._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         dVar104 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar85 = vfmadd231sd_fma(auVar74,auVar6,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         dVar104 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
    auVar5 = vfmadd231sd_fma(auVar86,auVar6,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar106._8_8_ = 0;
    auVar106._0_8_ =
         dVar104 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar6 = vfmadd231sd_fma(auVar106,auVar6,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar85 = vfmadd231sd_fma(auVar85,auVar73,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar5 = vfmadd231sd_fma(auVar5,auVar73,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar73 = vfmadd231sd_fma(auVar6,auVar73,auVar16);
    local_d8.m_data[1] = (double)auVar5._0_8_;
    local_d8.m_data[0] = (double)auVar85._0_8_;
    local_d8.m_data[2] = auVar73._0_8_;
    iVar55 = (*(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])
                       (pCVar37,CONCAT44(in_register_00000034,off));
    if (*(char *)(CONCAT44(extraout_var,iVar55) + 0x2c) == '\0') {
      ChBodyFrame::To_abs_forcetorque
                ((this->super_ChLink).Body2,&local_d8,
                 &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&CStack_68,
                 &CStack_a8);
      iVar55 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                 _vptr_ChFrame[0x10])();
      lVar56 = (long)*(int *)(CONCAT44(extraout_var_00,iVar55) + 0x30);
      if ((lVar56 < 0) ||
         ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < lVar56)) goto LAB_00580437;
      pdVar57 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar56;
      uVar58 = 3;
      if (((ulong)pdVar57 & 7) == 0) {
        uVar59 = -((uint)((ulong)pdVar57 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar59 < 3) {
          uVar58 = (ulong)uVar59;
        }
        if (uVar59 != 0) goto LAB_0057fd3c;
      }
      else {
LAB_0057fd3c:
        uVar61 = 0;
        do {
          pdVar57[uVar61] = pdVar57[uVar61] - dStack_b8 * CStack_68.m_data[uVar61];
          uVar61 = uVar61 + 1;
        } while (uVar58 != uVar61);
      }
      if (uVar58 < 3) {
        do {
          pdVar57[uVar58] = pdVar57[uVar58] - dStack_b8 * CStack_68.m_data[uVar58];
          uVar58 = uVar58 + 1;
        } while (uVar58 != 3);
      }
      pCVar37 = (this->super_ChLink).Body2;
      auVar95._8_8_ = CStack_a8.m_data[0];
      auVar95._0_8_ = CStack_a8.m_data[0];
      auVar101._8_8_ = CStack_a8.m_data[2];
      auVar101._0_8_ = CStack_a8.m_data[2];
      auVar75._0_8_ =
           CStack_a8.m_data[1] *
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar75._8_8_ =
           CStack_a8.m_data[1] *
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar87._8_8_ = 0;
      auVar87._0_8_ =
           CStack_a8.m_data[1] *
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar85 = vfmadd231sd_fma(auVar87,auVar95,auVar17);
      auVar73 = vfmadd231pd_fma(auVar75,auVar95,
                                *(undefined1 (*) [16])
                                 (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.
                                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array);
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar85 = vfmadd231sd_fma(auVar85,auVar101,auVar18);
      local_88 = vfmadd231pd_fma(auVar73,auVar101,
                                 *(undefined1 (*) [16])
                                  ((pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.
                                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
      alStack_78[0] = auVar85._0_8_;
      iVar55 = (*(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      lVar56 = (long)*(int *)(CONCAT44(extraout_var_01,iVar55) + 0x30);
      if ((lVar56 < -3) ||
         ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < lVar56 + 3)) goto LAB_00580437;
      auVar51._8_8_ = lStack_b0;
      auVar51._0_8_ = dStack_b8;
      pdVar57 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar56 + 3;
      uVar59 = 3;
      if (((ulong)pdVar57 & 7) == 0) {
        uVar60 = -((uint)((ulong)pdVar57 >> 3) & 0x1fffffff) & 7;
        if (uVar60 < 3) {
          uVar59 = uVar60;
        }
        if (uVar60 != 0) goto LAB_0057fe23;
      }
      else {
LAB_0057fe23:
        auVar64 = vbroadcastsd_avx512f(auVar51);
        auVar65 = vpbroadcastq_avx512f();
        uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963cc0,5);
        bVar39 = (byte)uVar58;
        auVar65._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * local_88._8_8_;
        auVar65._0_8_ = (ulong)(bVar39 & 1) * local_88._0_8_;
        auVar65._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * alStack_78[0];
        auVar65._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * alStack_78[1];
        auVar65._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)CStack_68.m_data[0];
        auVar65._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)CStack_68.m_data[1];
        auVar65._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)CStack_68.m_data[2];
        auVar65._56_8_ = (uVar58 >> 7) * lStack_50;
        auVar66._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)pdVar57[1];
        auVar66._0_8_ = (ulong)(bVar39 & 1) * (long)*pdVar57;
        auVar66._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)pdVar57[2];
        auVar66._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * (long)pdVar57[3];
        auVar66._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)pdVar57[4];
        auVar66._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)pdVar57[5];
        auVar66._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)pdVar57[6];
        auVar66._56_8_ = (uVar58 >> 7) * (long)pdVar57[7];
        auVar64 = vmulpd_avx512f(auVar65,auVar64);
        auVar64 = vsubpd_avx512f(auVar66,auVar64);
        bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
        *pdVar57 = (double)((ulong)(bVar39 & 1) * auVar64._0_8_ |
                           (ulong)!(bool)(bVar39 & 1) * (long)*pdVar57);
        pdVar57[1] = (double)((ulong)bVar40 * auVar64._8_8_ | (ulong)!bVar40 * (long)pdVar57[1]);
        pdVar57[2] = (double)((ulong)bVar41 * auVar64._16_8_ | (ulong)!bVar41 * (long)pdVar57[2]);
        pdVar57[3] = (double)((ulong)bVar42 * auVar64._24_8_ | (ulong)!bVar42 * (long)pdVar57[3]);
        pdVar57[4] = (double)((ulong)bVar43 * auVar64._32_8_ | (ulong)!bVar43 * (long)pdVar57[4]);
        pdVar57[5] = (double)((ulong)bVar44 * auVar64._40_8_ | (ulong)!bVar44 * (long)pdVar57[5]);
        pdVar57[6] = (double)((ulong)bVar45 * auVar64._48_8_ | (ulong)!bVar45 * (long)pdVar57[6]);
        pdVar57[7] = (double)((uVar58 >> 7) * auVar64._56_8_ |
                             (ulong)!SUB81(uVar58 >> 7,0) * (long)pdVar57[7]);
      }
      if (uVar59 < 3) {
        uVar61 = (ulong)(uVar59 << 3);
        auVar62 = vpbroadcastq_avx512vl();
        uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
        uVar58 = uVar58 & 0xf;
        bVar39 = (byte)uVar58;
        plVar1 = (long *)((long)pdVar57 + uVar61);
        auVar62._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * plVar1[1];
        auVar62._0_8_ = (ulong)(bVar39 & 1) * *plVar1;
        auVar62._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * plVar1[2];
        auVar62._24_8_ = (uVar58 >> 3) * plVar1[3];
        auVar83._0_8_ = (double)((ulong)(bVar39 & 1) * *(long *)(local_88 + uVar61)) * dStack_b8;
        auVar83._8_8_ =
             (double)((ulong)((byte)(uVar58 >> 1) & 1) * *(long *)(local_88 + uVar61 + 8)) *
             dStack_b8;
        auVar83._16_8_ =
             (double)((ulong)((byte)(uVar58 >> 2) & 1) * *(long *)((long)alStack_78 + uVar61)) *
             dStack_b8;
        auVar83._24_8_ =
             (double)((uVar58 >> 3) * *(long *)((long)CStack_68.m_data + (uVar61 - 8))) * dStack_b8;
        auVar62 = vsubpd_avx(auVar62,auVar83);
        puVar2 = (ulong *)((long)pdVar57 + uVar61);
        bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
        *puVar2 = (ulong)(bVar39 & 1) * auVar62._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar2;
        puVar2[1] = (ulong)bVar40 * auVar62._8_8_ | (ulong)!bVar40 * puVar2[1];
        puVar2[2] = (ulong)bVar41 * auVar62._16_8_ | (ulong)!bVar41 * puVar2[2];
        puVar2[3] = (uVar58 >> 3) * auVar62._24_8_ | (ulong)!SUB81(uVar58 >> 3,0) * puVar2[3];
      }
    }
    iVar55 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var_02,iVar55) + 0x2c) == '\0') {
      ChBodyFrame::To_abs_forcetorque
                ((this->super_ChLink).Body1,&local_d8,
                 &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&CStack_68,
                 &CStack_a8);
      iVar55 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                 _vptr_ChFrame[0x10])();
      lVar56 = (long)*(int *)(CONCAT44(extraout_var_03,iVar55) + 0x30);
      if ((lVar56 < 0) ||
         ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < lVar56)) goto LAB_00580437;
      pdVar57 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar56;
      uVar58 = 3;
      if (((ulong)pdVar57 & 7) == 0) {
        uVar59 = -((uint)((ulong)pdVar57 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar59 < 3) {
          uVar58 = (ulong)uVar59;
        }
        if (uVar59 != 0) goto LAB_0057ff3e;
      }
      else {
LAB_0057ff3e:
        uVar61 = 0;
        do {
          pdVar57[uVar61] = dStack_b8 * CStack_68.m_data[uVar61] + pdVar57[uVar61];
          uVar61 = uVar61 + 1;
        } while (uVar58 != uVar61);
      }
      if (uVar58 < 3) {
        do {
          pdVar57[uVar58] = dStack_b8 * CStack_68.m_data[uVar58] + pdVar57[uVar58];
          uVar58 = uVar58 + 1;
        } while (uVar58 != 3);
      }
      pCVar37 = (this->super_ChLink).Body1;
      auVar96._8_8_ = CStack_a8.m_data[0];
      auVar96._0_8_ = CStack_a8.m_data[0];
      auVar102._8_8_ = CStack_a8.m_data[2];
      auVar102._0_8_ = CStack_a8.m_data[2];
      auVar76._0_8_ =
           CStack_a8.m_data[1] *
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar76._8_8_ =
           CStack_a8.m_data[1] *
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar88._8_8_ = 0;
      auVar88._0_8_ =
           CStack_a8.m_data[1] *
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar85 = vfmadd231sd_fma(auVar88,auVar96,auVar19);
      auVar73 = vfmadd231pd_fma(auVar76,auVar96,
                                *(undefined1 (*) [16])
                                 (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.
                                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array);
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar85 = vfmadd231sd_fma(auVar85,auVar102,auVar20);
      local_88 = vfmadd231pd_fma(auVar73,auVar102,
                                 *(undefined1 (*) [16])
                                  ((pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.
                                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
      alStack_78[0] = auVar85._0_8_;
      iVar55 = (*(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      lVar56 = (long)*(int *)(CONCAT44(extraout_var_04,iVar55) + 0x30);
      if ((lVar56 < -3) ||
         ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < lVar56 + 3)) goto LAB_00580437;
      auVar52._8_8_ = lStack_b0;
      auVar52._0_8_ = dStack_b8;
      pdVar57 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar56 + 3;
      uVar59 = 3;
      if (((ulong)pdVar57 & 7) == 0) {
        uVar60 = -((uint)((ulong)pdVar57 >> 3) & 0x1fffffff) & 7;
        if (uVar60 < 3) {
          uVar59 = uVar60;
        }
        if (uVar60 != 0) goto LAB_0058001a;
      }
      else {
LAB_0058001a:
        auVar64 = vbroadcastsd_avx512f(auVar52);
        auVar65 = vpbroadcastq_avx512f();
        uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963cc0,5);
        bVar39 = (byte)uVar58;
        auVar67._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * local_88._8_8_;
        auVar67._0_8_ = (ulong)(bVar39 & 1) * local_88._0_8_;
        auVar67._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * alStack_78[0];
        auVar67._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * alStack_78[1];
        auVar67._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)CStack_68.m_data[0];
        auVar67._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)CStack_68.m_data[1];
        auVar67._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)CStack_68.m_data[2];
        auVar67._56_8_ = (uVar58 >> 7) * lStack_50;
        auVar68._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)pdVar57[1];
        auVar68._0_8_ = (ulong)(bVar39 & 1) * (long)*pdVar57;
        auVar68._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)pdVar57[2];
        auVar68._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * (long)pdVar57[3];
        auVar68._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)pdVar57[4];
        auVar68._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)pdVar57[5];
        auVar68._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)pdVar57[6];
        auVar68._56_8_ = (uVar58 >> 7) * (long)pdVar57[7];
        auVar64 = vmulpd_avx512f(auVar67,auVar64);
        auVar64 = vaddpd_avx512f(auVar64,auVar68);
        bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
        *pdVar57 = (double)((ulong)(bVar39 & 1) * auVar64._0_8_ |
                           (ulong)!(bool)(bVar39 & 1) * (long)*pdVar57);
        pdVar57[1] = (double)((ulong)bVar40 * auVar64._8_8_ | (ulong)!bVar40 * (long)pdVar57[1]);
        pdVar57[2] = (double)((ulong)bVar41 * auVar64._16_8_ | (ulong)!bVar41 * (long)pdVar57[2]);
        pdVar57[3] = (double)((ulong)bVar42 * auVar64._24_8_ | (ulong)!bVar42 * (long)pdVar57[3]);
        pdVar57[4] = (double)((ulong)bVar43 * auVar64._32_8_ | (ulong)!bVar43 * (long)pdVar57[4]);
        pdVar57[5] = (double)((ulong)bVar44 * auVar64._40_8_ | (ulong)!bVar44 * (long)pdVar57[5]);
        pdVar57[6] = (double)((ulong)bVar45 * auVar64._48_8_ | (ulong)!bVar45 * (long)pdVar57[6]);
        pdVar57[7] = (double)((uVar58 >> 7) * auVar64._56_8_ |
                             (ulong)!SUB81(uVar58 >> 7,0) * (long)pdVar57[7]);
      }
      if (uVar59 < 3) {
        uVar61 = (ulong)(uVar59 << 3);
        auVar62 = vpbroadcastq_avx512vl();
        uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
        uVar58 = uVar58 & 0xf;
        lVar56 = *(long *)(local_88 + uVar61 + 8);
        lVar46 = *(long *)((long)alStack_78 + uVar61);
        lVar47 = *(long *)((long)CStack_68.m_data + (uVar61 - 8));
        bVar39 = (byte)uVar58;
        plVar1 = (long *)((long)pdVar57 + uVar61);
        lVar48 = plVar1[1];
        lVar49 = plVar1[2];
        lVar50 = plVar1[3];
        puVar2 = (ulong *)((long)pdVar57 + uVar61);
        bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
        *puVar2 = (ulong)(bVar39 & 1) *
                  (long)((double)((ulong)(bVar39 & 1) * *(long *)(local_88 + uVar61)) * dStack_b8 +
                        (double)((ulong)(bVar39 & 1) * *plVar1)) |
                  (ulong)!(bool)(bVar39 & 1) * *puVar2;
        puVar2[1] = (ulong)bVar40 *
                    (long)((double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar56) * dStack_b8 +
                          (double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar48)) |
                    (ulong)!bVar40 * puVar2[1];
        puVar2[2] = (ulong)bVar41 *
                    (long)((double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar46) * dStack_b8 +
                          (double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar49)) |
                    (ulong)!bVar41 * puVar2[2];
        puVar2[3] = (uVar58 >> 3) *
                    (long)((double)((uVar58 >> 3) * lVar47) * dStack_b8 +
                          (double)((uVar58 >> 3) * lVar50)) |
                    (ulong)!SUB81(uVar58 >> 3,0) * puVar2[3];
      }
    }
  }
  dVar104 = (this->C_torque).m_data[0];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar104;
  dVar3 = (this->C_torque).m_data[1];
  dVar4 = (this->C_torque).m_data[2];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar4;
  if ((((dVar104 == 0.0) && (!NAN(dVar104))) && (dVar3 == 0.0)) &&
     (((!NAN(dVar3) && (dVar4 == 0.0)) && (!NAN(dVar4))))) {
    return;
  }
  pCVar38 = this->marker2;
  pCVar37 = (this->super_ChLink).Body2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       dVar3 * (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar73 = vfmadd231sd_fma(auVar107,auVar77,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       dVar3 * (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  auVar85 = vfmadd231sd_fma(auVar103,auVar77,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       dVar3 * (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  auVar5 = vfmadd231sd_fma(auVar97,auVar77,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar73 = vfmadd231sd_fma(auVar73,auVar89,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar85 = vfmadd231sd_fma(auVar85,auVar89,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar5 = vfmadd231sd_fma(auVar5,auVar89,auVar26);
  dVar104 = auVar73._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       dVar104 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar73 = vfmadd231sd_fma(auVar78,auVar85,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_28 = vfmadd231sd_fma(auVar73,auVar5,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       dVar104 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar73 = vfmadd231sd_fma(auVar79,auVar85,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_38 = vfmadd231sd_fma(auVar73,auVar5,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       dVar104 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar73 = vfmadd231sd_fma(auVar80,auVar85,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_48 = vfmadd231sd_fma(auVar73,auVar5,auVar32);
  iVar55 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_05,iVar55) + 0x2c) == '\0') {
    pCVar37 = (this->super_ChLink).Body1;
    auVar90._0_8_ =
         (double)local_38._0_8_ *
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar90._8_8_ =
         (double)local_38._0_8_ *
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar81._8_8_ = 0;
    auVar81._0_8_ =
         (double)local_38._0_8_ *
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar85 = vfmadd231sd_fma(auVar81,local_28,auVar33);
    auVar98._0_8_ = local_28._0_8_;
    auVar98._8_8_ = auVar98._0_8_;
    auVar73 = vfmadd132pd_fma(auVar98,auVar90,
                              *(undefined1 (*) [16])
                               (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar91._8_8_ = local_48._0_8_;
    auVar91._0_8_ = local_48._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar85 = vfmadd231sd_fma(auVar85,local_48,auVar34);
    local_d8.m_data._0_16_ =
         vfmadd132pd_fma(auVar91,auVar73,
                         *(undefined1 (*) [16])
                          ((pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    local_d8.m_data[2] = auVar85._0_8_;
    iVar55 = (*(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    lVar56 = (long)*(int *)(CONCAT44(extraout_var_06,iVar55) + 0x30);
    if ((lVar56 < -3) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar56 + 3)) goto LAB_00580437;
    auVar53._8_8_ = lStack_b0;
    auVar53._0_8_ = dStack_b8;
    pdVar57 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar56 + 3;
    uVar59 = 3;
    if (((ulong)pdVar57 & 7) == 0) {
      uVar60 = -((uint)((ulong)pdVar57 >> 3) & 0x1fffffff) & 7;
      if (uVar60 < 3) {
        uVar59 = uVar60;
      }
      if (uVar60 != 0) goto LAB_00580256;
    }
    else {
LAB_00580256:
      auVar64 = vbroadcastsd_avx512f(auVar53);
      auVar65 = vpbroadcastq_avx512f();
      uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963cc0,5);
      bVar39 = (byte)uVar58;
      auVar69._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)local_d8.m_data[1];
      auVar69._0_8_ = (ulong)(bVar39 & 1) * (long)local_d8.m_data[0];
      auVar69._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)local_d8.m_data[2];
      auVar69._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * lStack_c0;
      auVar69._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)dStack_b8;
      auVar69._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * lStack_b0;
      auVar69._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)CStack_a8.m_data[0];
      auVar69._56_8_ = (uVar58 >> 7) * (long)CStack_a8.m_data[1];
      auVar70._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)pdVar57[1];
      auVar70._0_8_ = (ulong)(bVar39 & 1) * (long)*pdVar57;
      auVar70._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)pdVar57[2];
      auVar70._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * (long)pdVar57[3];
      auVar70._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)pdVar57[4];
      auVar70._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)pdVar57[5];
      auVar70._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)pdVar57[6];
      auVar70._56_8_ = (uVar58 >> 7) * (long)pdVar57[7];
      auVar64 = vmulpd_avx512f(auVar69,auVar64);
      auVar64 = vaddpd_avx512f(auVar64,auVar70);
      bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
      bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
      bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
      bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
      bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
      *pdVar57 = (double)((ulong)(bVar39 & 1) * auVar64._0_8_ |
                         (ulong)!(bool)(bVar39 & 1) * (long)*pdVar57);
      pdVar57[1] = (double)((ulong)bVar40 * auVar64._8_8_ | (ulong)!bVar40 * (long)pdVar57[1]);
      pdVar57[2] = (double)((ulong)bVar41 * auVar64._16_8_ | (ulong)!bVar41 * (long)pdVar57[2]);
      pdVar57[3] = (double)((ulong)bVar42 * auVar64._24_8_ | (ulong)!bVar42 * (long)pdVar57[3]);
      pdVar57[4] = (double)((ulong)bVar43 * auVar64._32_8_ | (ulong)!bVar43 * (long)pdVar57[4]);
      pdVar57[5] = (double)((ulong)bVar44 * auVar64._40_8_ | (ulong)!bVar44 * (long)pdVar57[5]);
      pdVar57[6] = (double)((ulong)bVar45 * auVar64._48_8_ | (ulong)!bVar45 * (long)pdVar57[6]);
      pdVar57[7] = (double)((uVar58 >> 7) * auVar64._56_8_ |
                           (ulong)!SUB81(uVar58 >> 7,0) * (long)pdVar57[7]);
    }
    if (uVar59 < 3) {
      uVar61 = (ulong)(uVar59 << 3);
      auVar62 = vpbroadcastq_avx512vl();
      uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
      uVar58 = uVar58 & 0xf;
      lVar56 = *(long *)((long)local_d8.m_data + uVar61 + 8);
      lVar46 = *(long *)((long)local_d8.m_data + uVar61 + 0x10);
      lVar47 = *(long *)((long)&lStack_c0 + uVar61);
      bVar39 = (byte)uVar58;
      plVar1 = (long *)((long)pdVar57 + uVar61);
      lVar48 = plVar1[1];
      lVar49 = plVar1[2];
      lVar50 = plVar1[3];
      puVar2 = (ulong *)((long)pdVar57 + uVar61);
      bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
      *puVar2 = (ulong)(bVar39 & 1) *
                (long)((double)((ulong)(bVar39 & 1) * *(long *)((long)local_d8.m_data + uVar61)) *
                       dStack_b8 + (double)((ulong)(bVar39 & 1) * *plVar1)) |
                (ulong)!(bool)(bVar39 & 1) * *puVar2;
      puVar2[1] = (ulong)bVar40 *
                  (long)((double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar56) * dStack_b8 +
                        (double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar48)) |
                  (ulong)!bVar40 * puVar2[1];
      puVar2[2] = (ulong)bVar41 *
                  (long)((double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar46) * dStack_b8 +
                        (double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar49)) |
                  (ulong)!bVar41 * puVar2[2];
      puVar2[3] = (uVar58 >> 3) *
                  (long)((double)((uVar58 >> 3) * lVar47) * dStack_b8 +
                        (double)((uVar58 >> 3) * lVar50)) | (ulong)!SUB81(uVar58 >> 3,0) * puVar2[3]
      ;
    }
  }
  iVar55 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_07,iVar55) + 0x2c) != '\0') {
    return;
  }
  pCVar37 = (this->super_ChLink).Body2;
  auVar92._0_8_ =
       (double)local_38._0_8_ *
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar92._8_8_ =
       (double)local_38._0_8_ *
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (double)local_38._0_8_ *
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar85 = vfmadd231sd_fma(auVar82,local_28,auVar35);
  auVar99._0_8_ = local_28._0_8_;
  auVar99._8_8_ = auVar99._0_8_;
  auVar73 = vfmadd132pd_fma(auVar99,auVar92,
                            *(undefined1 (*) [16])
                             (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar93._8_8_ = local_48._0_8_;
  auVar93._0_8_ = local_48._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar85 = vfmadd231sd_fma(auVar85,local_48,auVar36);
  local_d8.m_data._0_16_ =
       vfmadd132pd_fma(auVar93,auVar73,
                       *(undefined1 (*) [16])
                        ((pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 6));
  local_d8.m_data[2] = auVar85._0_8_;
  iVar55 = (*(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  lVar56 = (long)*(int *)(CONCAT44(extraout_var_08,iVar55) + 0x30);
  if ((lVar56 < -3) ||
     ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      lVar56 + 3)) {
LAB_00580437:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  auVar54._8_8_ = lStack_b0;
  auVar54._0_8_ = dStack_b8;
  pdVar57 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
            lVar56 + 3;
  uVar59 = 3;
  if (((ulong)pdVar57 & 7) == 0) {
    uVar60 = -((uint)((ulong)pdVar57 >> 3) & 0x1fffffff) & 7;
    if (uVar60 < 3) {
      uVar59 = uVar60;
    }
    if (uVar60 == 0) goto LAB_005803e5;
  }
  auVar64 = vbroadcastsd_avx512f(auVar54);
  auVar65 = vpbroadcastq_avx512f();
  uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963cc0,5);
  bVar39 = (byte)uVar58;
  auVar71._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)local_d8.m_data[1];
  auVar71._0_8_ = (ulong)(bVar39 & 1) * (long)local_d8.m_data[0];
  auVar71._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)local_d8.m_data[2];
  auVar71._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * lStack_c0;
  auVar71._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)dStack_b8;
  auVar71._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * lStack_b0;
  auVar71._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)CStack_a8.m_data[0];
  auVar71._56_8_ = (uVar58 >> 7) * (long)CStack_a8.m_data[1];
  auVar72._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)pdVar57[1];
  auVar72._0_8_ = (ulong)(bVar39 & 1) * (long)*pdVar57;
  auVar72._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)pdVar57[2];
  auVar72._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * (long)pdVar57[3];
  auVar72._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)pdVar57[4];
  auVar72._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)pdVar57[5];
  auVar72._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)pdVar57[6];
  auVar72._56_8_ = (uVar58 >> 7) * (long)pdVar57[7];
  auVar64 = vmulpd_avx512f(auVar71,auVar64);
  auVar64 = vsubpd_avx512f(auVar72,auVar64);
  bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
  bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
  bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
  bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
  bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
  bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
  *pdVar57 = (double)((ulong)(bVar39 & 1) * auVar64._0_8_ |
                     (ulong)!(bool)(bVar39 & 1) * (long)*pdVar57);
  pdVar57[1] = (double)((ulong)bVar40 * auVar64._8_8_ | (ulong)!bVar40 * (long)pdVar57[1]);
  pdVar57[2] = (double)((ulong)bVar41 * auVar64._16_8_ | (ulong)!bVar41 * (long)pdVar57[2]);
  pdVar57[3] = (double)((ulong)bVar42 * auVar64._24_8_ | (ulong)!bVar42 * (long)pdVar57[3]);
  pdVar57[4] = (double)((ulong)bVar43 * auVar64._32_8_ | (ulong)!bVar43 * (long)pdVar57[4]);
  pdVar57[5] = (double)((ulong)bVar44 * auVar64._40_8_ | (ulong)!bVar44 * (long)pdVar57[5]);
  pdVar57[6] = (double)((ulong)bVar45 * auVar64._48_8_ | (ulong)!bVar45 * (long)pdVar57[6]);
  pdVar57[7] = (double)((uVar58 >> 7) * auVar64._56_8_ |
                       (ulong)!SUB81(uVar58 >> 7,0) * (long)pdVar57[7]);
LAB_005803e5:
  if (uVar59 < 3) {
    uVar61 = (ulong)(uVar59 << 3);
    auVar62 = vpbroadcastq_avx512vl();
    uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
    uVar58 = uVar58 & 0xf;
    bVar39 = (byte)uVar58;
    plVar1 = (long *)((long)pdVar57 + uVar61);
    auVar63._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * plVar1[1];
    auVar63._0_8_ = (ulong)(bVar39 & 1) * *plVar1;
    auVar63._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * plVar1[2];
    auVar63._24_8_ = (uVar58 >> 3) * plVar1[3];
    auVar84._0_8_ =
         (double)((ulong)(bVar39 & 1) * *(long *)((long)local_d8.m_data + uVar61)) * dStack_b8;
    auVar84._8_8_ =
         (double)((ulong)((byte)(uVar58 >> 1) & 1) * *(long *)((long)local_d8.m_data + uVar61 + 8))
         * dStack_b8;
    auVar84._16_8_ =
         (double)((ulong)((byte)(uVar58 >> 2) & 1) *
                 *(long *)((long)local_d8.m_data + uVar61 + 0x10)) * dStack_b8;
    auVar84._24_8_ = (double)((uVar58 >> 3) * *(long *)((long)&lStack_c0 + uVar61)) * dStack_b8;
    auVar62 = vsubpd_avx(auVar63,auVar84);
    puVar2 = (ulong *)((long)pdVar57 + uVar61);
    bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
    bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
    *puVar2 = (ulong)(bVar39 & 1) * auVar62._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar40 * auVar62._8_8_ | (ulong)!bVar40 * puVar2[1];
    puVar2[2] = (ulong)bVar41 * auVar62._16_8_ | (ulong)!bVar41 * puVar2[2];
    puVar2[3] = (uVar58 >> 3) * auVar62._24_8_ | (ulong)!SUB81(uVar58 >> 3,0) * puVar2[3];
  }
  return;
}

Assistant:

void ChLinkMarkers::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    if (!Body1 || !Body2)
        return;

    Vector mbody_force;
    Vector mbody_torque;
    if (Vnotnull(C_force)) {
        Vector m_abs_force = Body2->GetA() * (marker2->GetA() * C_force);

        if (Body2->Variables().IsActive()) {
            Body2->To_abs_forcetorque(m_abs_force,
                                      marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                      false,                       // from abs. space
                                      mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
            R.segment(Body2->Variables().GetOffset() + 0, 3) -= c * mbody_force.eigen();
            R.segment(Body2->Variables().GetOffset() + 3, 3) -=
                c * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();
        }

        if (Body1->Variables().IsActive()) {
            Body1->To_abs_forcetorque(m_abs_force,
                                      marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                      false,                       // from abs. space
                                      mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
            R.segment(Body1->Variables().GetOffset() + 0, 3) += c * mbody_force.eigen();
            R.segment(Body1->Variables().GetOffset() + 3, 3) +=
                c * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
        }
    }
    if (Vnotnull(C_torque)) {
        Vector m_abs_torque = Body2->GetA() * (marker2->GetA() * C_torque);
        // load torques in 'fb' vector accumulator of body variables (torques in local coords)
        if (Body1->Variables().IsActive()) {
            R.segment(Body1->Variables().GetOffset() + 3, 3) +=
                c * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
        }
        if (Body2->Variables().IsActive()) {
            R.segment(Body2->Variables().GetOffset() + 3, 3) -=
                c * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
        }
    }
}